

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastAdderCLA(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int fSign,int CarryIn)

{
  int iVar1;
  int *pAdd0_00;
  int *pAdd1_00;
  byte bVar2;
  int local_50;
  int local_4c;
  int *pAdd1n;
  int *pAdd0n;
  int local_30;
  int Log2;
  int i;
  int CarryIn_local;
  int fSign_local;
  int nBits_local;
  int *pAdd1_local;
  int *pAdd0_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Abc_Base2Log(nBits);
  bVar2 = (byte)iVar1;
  pAdd0_00 = (int *)calloc((long)(1 << (bVar2 & 0x1f)),4);
  pAdd1_00 = (int *)calloc((long)(1 << (bVar2 & 0x1f)),4);
  for (local_30 = 0; local_30 < nBits; local_30 = local_30 + 1) {
    pAdd0_00[local_30] = pAdd0[local_30];
    pAdd1_00[local_30] = pAdd1[local_30];
  }
  for (; local_30 < 1 << (bVar2 & 0x1f); local_30 = local_30 + 1) {
    if (fSign == 0) {
      local_4c = 0;
    }
    else {
      local_4c = pAdd0[nBits + -1];
    }
    pAdd0_00[local_30] = local_4c;
    if (fSign == 0) {
      local_50 = 0;
    }
    else {
      local_50 = pAdd1[nBits + -1];
    }
    pAdd1_00[local_30] = local_50;
  }
  Wlc_BlastAdderCLA_int(pNew,pAdd0_00,pAdd1_00,1 << (bVar2 & 0x1f),CarryIn);
  for (local_30 = 0; local_30 < nBits; local_30 = local_30 + 1) {
    pAdd0[local_30] = pAdd0_00[local_30];
  }
  if (pAdd0_00 != (int *)0x0) {
    free(pAdd0_00);
  }
  if (pAdd1_00 != (int *)0x0) {
    free(pAdd1_00);
  }
  return;
}

Assistant:

void Wlc_BlastAdderCLA( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int fSign, int CarryIn ) // result is in pAdd0
{
    int i, Log2 = Abc_Base2Log(nBits);
    int * pAdd0n = ABC_CALLOC( int, 1<<Log2 );
    int * pAdd1n = ABC_CALLOC( int, 1<<Log2 );
    for ( i = 0; i < nBits; i++ )
    {
        pAdd0n[i] = pAdd0[i];
        pAdd1n[i] = pAdd1[i];
    }
    for ( ; i < (1<<Log2); i++ )
    {
        pAdd0n[i] = fSign ? pAdd0[nBits-1] : 0;
        pAdd1n[i] = fSign ? pAdd1[nBits-1] : 0;
    }
    Wlc_BlastAdderCLA_int( pNew, pAdd0n, pAdd1n, 1<<Log2, CarryIn );
    for ( i = 0; i < nBits; i++ )
        pAdd0[i] = pAdd0n[i];
    ABC_FREE(pAdd0n);
    ABC_FREE(pAdd1n);
}